

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O0

void __thiscall QuickImpl::QuickImpl(QuickImpl *this,uint16_t port,bool as_server,QuickCallback *cb)

{
  pointer pTVar1;
  TaskQueueBase *task_queue;
  type local_78;
  RepeatingTaskHandle local_70;
  type local_68 [3];
  allocator<char> local_49;
  string local_48 [32];
  unique_ptr<dd::TaskQueueBase,_dd::TaskQueueDeleter> local_28;
  QuickCallback *local_20;
  QuickCallback *cb_local;
  bool as_server_local;
  QuickImpl *pQStack_10;
  uint16_t port_local;
  QuickImpl *this_local;
  
  local_20 = cb;
  cb_local._5_1_ = as_server;
  cb_local._6_2_ = port;
  pQStack_10 = this;
  Quick::Quick(&this->super_Quick);
  (this->super_Quick)._vptr_Quick = (_func_int **)&PTR_ConnectToServer_001c07b8;
  dd::CreateTaskQueueFactory();
  pTVar1 = std::unique_ptr<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>::
           operator->(&this->_task_queue_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"quick",&local_49);
  (*pTVar1->_vptr_TaskQueueFactory[2])(&local_28,pTVar1,local_48,0);
  dd::TaskQueue::TaskQueue(&this->_task_queue,&local_28);
  std::unique_ptr<dd::TaskQueueBase,_dd::TaskQueueDeleter>::~unique_ptr(&local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  dd::RepeatingTaskHandle::RepeatingTaskHandle(&this->_repeating_task);
  std::unique_ptr<dd::ProcessThread,std::default_delete<dd::ProcessThread>>::
  unique_ptr<std::default_delete<dd::ProcessThread>,void>
            ((unique_ptr<dd::ProcessThread,std::default_delete<dd::ProcessThread>> *)
             &this->_paced_thread);
  this->_local_port = cb_local._6_2_;
  this->_as_server = (bool)(cb_local._5_1_ & 1);
  std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::
  unique_ptr<std::default_delete<PacketReader>,void>
            ((unique_ptr<PacketReader,std::default_delete<PacketReader>> *)&this->_packet_reader);
  std::unique_ptr<UdpSocket,std::default_delete<UdpSocket>>::
  unique_ptr<std::default_delete<UdpSocket>,void>
            ((unique_ptr<UdpSocket,std::default_delete<UdpSocket>> *)&this->_udp_socket);
  std::
  unordered_map<unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>_>
  ::unordered_map(&this->_connections);
  this->_quick_cb = local_20;
  dd::Lock::Lock(&this->_quick_lock);
  this->_received_time_microseconds = 0;
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)&this->_ack_thread);
  std::unique_ptr<AckThread,std::default_delete<AckThread>>::
  unique_ptr<std::default_delete<AckThread>,void>
            ((unique_ptr<AckThread,std::default_delete<AckThread>> *)&this->_ack_thread_impl);
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  LogWrapper::Load();
  LogWrapper::Open(&g_quic_log,"quic");
  InitQuck(this);
  local_68[0].this = this;
  dd::TaskQueue::
  PostTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:21:23),_nullptr>
            (&this->_task_queue,local_68);
  task_queue = dd::TaskQueue::Get(&this->_task_queue);
  local_78.this = this;
  dd::RepeatingTaskHandle::
  DelayedStart<QuickImpl::QuickImpl(unsigned_short,bool,QuickCallback*)::__1>
            (&local_70,task_queue,1000,&local_78);
  dd::RepeatingTaskHandle::operator=(&this->_repeating_task,&local_70);
  return;
}

Assistant:

QuickImpl::QuickImpl(uint16_t port, bool as_server, QuickCallback* cb)
	: _local_port(port), _as_server(as_server), _task_queue_factory(CreateTaskQueueFactory()),
	_task_queue(_task_queue_factory->CreateTaskQueue("quick", TaskQueueFactory::Priority::NORMAL)),
	_quick_cb(cb)
{
	LogWrapper::Load();
	g_quic_log.Open("quic");
	InitQuck();
	_task_queue.PostTask([this]() {
		_paced_thread = ProcessThread::Create("paced_sender");
		_paced_thread->Start();
	});

	_repeating_task = dd::RepeatingTaskHandle::DelayedStart(_task_queue.Get(), 1000, [this] {
		CheckTimeout();
		return 1000;
	});
}